

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintSmartPointer<libaom_test::CompressedVideoSource,std::unique_ptr<libaom_test::CompressedVideoSource,std::default_delete<libaom_test::CompressedVideoSource>>,void>
               (unique_ptr<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
                *ptr,ostream *os,int param_3)

{
  ostream *poVar1;
  char *pcVar2;
  
  if ((ptr->_M_t).
      super___uniq_ptr_impl<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
      ._M_t.
      super__Tuple_impl<0UL,_libaom_test::CompressedVideoSource_*,_std::default_delete<libaom_test::CompressedVideoSource>_>
      .super__Head_base<0UL,_libaom_test::CompressedVideoSource_*,_false>._M_head_impl ==
      (CompressedVideoSource *)0x0) {
    pcVar2 = "(nullptr)";
  }
  else {
    poVar1 = std::operator<<(os,"(ptr = ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,", value = ");
    RawBytesPrinter::PrintValue<libaom_test::CompressedVideoSource,8ul>
              ((ptr->_M_t).
               super___uniq_ptr_impl<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
               ._M_t.
               super__Tuple_impl<0UL,_libaom_test::CompressedVideoSource_*,_std::default_delete<libaom_test::CompressedVideoSource>_>
               .super__Head_base<0UL,_libaom_test::CompressedVideoSource_*,_false>._M_head_impl,os);
    pcVar2 = ")";
  }
  std::operator<<(os,pcVar2);
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}